

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixEnv::UnlockFile(PosixEnv *this,FileLock *lock)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar1 = in_RDX[1];
  piVar3 = __errno_location();
  *piVar3 = 0;
  local_48.field_2._8_8_ = 0;
  local_48._M_dataplus._M_p = (pointer)0x2;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0;
  iVar2 = fcntl((int)lVar1,6);
  if (iVar2 == -1) {
    std::operator+(&local_48,"unlock ",(string *)(in_RDX + 2));
    PosixError((string *)this,(int)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    PosixLockTable::Remove((PosixLockTable *)(lock + 0x18),(string *)(in_RDX + 2));
    close((int)in_RDX[1]);
    (**(code **)(*in_RDX + 8))();
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status UnlockFile(FileLock* lock) override {
    PosixFileLock* posix_file_lock = static_cast<PosixFileLock*>(lock);
    if (LockOrUnlock(posix_file_lock->fd(), false) == -1) {
      return PosixError("unlock " + posix_file_lock->filename(), errno);
    }
    locks_.Remove(posix_file_lock->filename());
    ::close(posix_file_lock->fd());
    delete posix_file_lock;
    return Status::OK();
  }